

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparser.cpp
# Opt level: O0

istream * operator>>(istream *stream,skip *x)

{
  bool bVar1;
  undefined8 *in_RSI;
  istream *in_RDI;
  bool bVar2;
  char *text;
  char c;
  fmtflags f;
  char *local_20;
  char local_15;
  fmtflags local_14;
  undefined8 *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  std::istream::operator>>(local_8,std::noskipws);
  local_20 = (char *)*local_10;
  while( true ) {
    bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
    bVar2 = false;
    if (bVar1) {
      bVar2 = *local_20 != '\0';
      local_20 = local_20 + 1;
    }
    if (!bVar2) break;
    std::operator>>(local_8,&local_15);
  }
  std::ios_base::flags((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),local_14);
  return local_8;
}

Assistant:

std::istream& operator >> (std::istream& stream, const skip& x)
{
    std::ios_base::fmtflags f = stream.flags();
    stream >> std::noskipws;

    char c;
    const char* text = x.text;
    while (stream && *text++)
        stream >> c;

    stream.flags(f);
    return stream;
}